

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

void ApplicativeHelper::getHeadAndArgs(Term *term,TermList *head,TermStack *args)

{
  bool bVar1;
  TermList *pTVar2;
  Stack<Kernel::TermList> *in_RDX;
  uint64_t *in_RSI;
  Term *in_RDI;
  Term *in_stack_ffffffffffffffc8;
  TermList in_stack_ffffffffffffffd0;
  uint64_t local_20;
  Term *local_8;
  
  bVar1 = Lib::Stack<Kernel::TermList>::isEmpty(in_RDX);
  if (!bVar1) {
    Lib::Stack<Kernel::TermList>::reset(in_RDX);
  }
  Kernel::TermList::TermList
            ((TermList *)in_stack_ffffffffffffffd0._content,in_stack_ffffffffffffffc8);
  *in_RSI = local_20;
  local_8 = in_RDI;
  while( true ) {
    bVar1 = Kernel::Term::isApplication((Term *)in_stack_ffffffffffffffd0._content);
    if (!bVar1) {
      return;
    }
    in_stack_ffffffffffffffd0._content = (uint64_t)in_RDX;
    Kernel::Term::nthArgument(local_8,3);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    pTVar2 = Kernel::Term::nthArgument(local_8,2);
    *in_RSI = pTVar2->_content;
    bVar1 = Kernel::TermList::isTerm((TermList *)0x8412de);
    if (!bVar1) break;
    local_8 = Kernel::TermList::term((TermList *)0x8412ee);
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(Term* term, TermList& head, TermStack& args)
{
  if(!args.isEmpty()){ args.reset(); }

  head = TermList(term);

  while(term->isApplication()){
    args.push(*term->nthArgument(3)); 
    head = *term->nthArgument(2);
    if(head.isTerm()){ 
      term = head.term();
    } else { break; }
  }

}